

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vacc(DisasContext_conflict13 *s,DisasOps *o)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  TCGContext_conflict12 *tcg_ctx;
  DisasJumpType DVar5;
  
  uVar2 = (s->fields).presentO;
  if ((uVar2 & 0x20) == 0) goto LAB_00ccc88f;
  bVar1 = (byte)(s->fields).c[3];
  if (bVar1 < 5) {
    tcg_ctx = s->uc->tcg_ctx;
    if (bVar1 == 4) {
      if ((((uVar2 >> 0x16 & 1) == 0) || ((uVar2 >> 0x17 & 1) == 0)) || ((uVar2 >> 0x18 & 1) == 0))
      {
LAB_00ccc88f:
        __assert_fail("have_field1(s, o)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                      ,0x44d,
                      "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
                     );
      }
      gen_gvec128_3_i64(tcg_ctx,gen_acc2_i64,(uint8_t)(s->fields).c[0],(uint8_t)(s->fields).c[6],
                        (uint8_t)(s->fields).c[2]);
    }
    else {
      if ((uVar2 >> 0x16 & 1) == 0) goto LAB_00ccc88f;
      uVar3 = (s->fields).c[0];
      if ((uVar3 & 0xe0) != 0) {
LAB_00ccc8ae:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                   ,0xdf,"reg < 32");
      }
      if ((uVar2 >> 0x17 & 1) == 0) goto LAB_00ccc88f;
      uVar4 = (s->fields).c[6];
      if ((uVar4 & 0xe0) != 0) goto LAB_00ccc8ae;
      if ((uVar2 >> 0x18 & 1) == 0) goto LAB_00ccc88f;
      uVar2 = (s->fields).c[2];
      if ((uVar2 & 0xe0) != 0) goto LAB_00ccc8ae;
      tcg_gen_gvec_3_s390x
                (tcg_ctx,(uVar3 & 0x1f) * 0x10 + 0x80,(uVar4 & 0x1f) * 0x10 + 0x80,
                 (uVar2 & 0x1f) * 0x10 + 0x80,0x10,0x10,
                 (GVecGen3_conflict12 *)((long)&op_vacc::g[0].fni8 + (ulong)((uint)bVar1 * 0x30)));
    }
    DVar5 = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    DVar5 = DISAS_NORETURN;
  }
  return DVar5;
}

Assistant:

static DisasJumpType op_vacc(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m4);
    static const GVecGen3 g[4] = {
        { .fni8 = gen_acc8_i64, },
        { .fni8 = gen_acc16_i64, },
        { .fni4 = gen_acc_i32, },
        { .fni8 = gen_acc_i64, },
    };

    if (es > ES_128) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    } else if (es == ES_128) {
        gen_gvec128_3_i64(tcg_ctx, gen_acc2_i64, get_field(s, v1),
                          get_field(s, v2), get_field(s, v3));
        return DISAS_NEXT;
    }
    gen_gvec_3(tcg_ctx, get_field(s, v1), get_field(s, v2),
               get_field(s, v3), &g[es]);
    return DISAS_NEXT;
}